

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::PointAccelerationLocalToParent
          (ChFrameMoving<double> *this,ChVector<double> *localpos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChVector<double> *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  dVar1 = localpos->m_data[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = localpos->m_data[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = localpos->m_data[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (this->coord_dtdt).rot.m_data[0];
  dVar2 = (this->coord_dtdt).rot.m_data[1];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1 * dVar2;
  auVar19 = vfmsub231sd_fma(auVar19,auVar15,ZEXT816(0) << 0x40);
  dVar3 = (this->coord_dtdt).rot.m_data[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar3;
  auVar19 = vfnmadd231sd_fma(auVar19,auVar20,auVar8);
  dVar4 = (this->coord_dtdt).rot.m_data[3];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar4;
  auVar9 = vfnmadd231sd_fma(auVar19,auVar23,auVar12);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2 * 0.0;
  auVar19 = vfmadd231sd_fma(auVar26,auVar15,auVar10);
  auVar19 = vfnmadd231sd_fma(auVar19,auVar23,auVar8);
  auVar19 = vfmadd231sd_fma(auVar19,auVar20,auVar12);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar3 * 0.0;
  auVar14 = vfmadd231sd_fma(auVar28,auVar15,auVar8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar23,auVar10);
  auVar23 = vfnmadd231sd_fma(auVar14,auVar17,auVar12);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar4 * 0.0;
  auVar14 = vfmadd231sd_fma(auVar24,auVar12,auVar15);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar10,auVar20);
  auVar14 = vfmadd231sd_fma(auVar14,auVar8,auVar17);
  dVar2 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[2];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar19._0_8_ * dVar2;
  auVar15 = vfnmadd231sd_fma(auVar32,auVar9,auVar18);
  auVar15 = vfmadd231sd_fma(auVar15,auVar14,auVar21);
  auVar17 = vfnmadd231sd_fma(auVar15,auVar23,auVar30);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar23._0_8_ * dVar2;
  auVar15 = vfnmadd231sd_fma(auVar34,auVar9,auVar21);
  auVar15 = vfnmadd231sd_fma(auVar15,auVar14,auVar18);
  auVar15 = vfmadd231sd_fma(auVar15,auVar19,auVar30);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar14._0_8_ * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar16,auVar30,auVar9);
  auVar14 = vfmadd231sd_fma(auVar14,auVar18,auVar23);
  auVar23 = vfnmadd231sd_fma(auVar14,auVar21,auVar19);
  dVar2 = (this->coord_dtdt).pos.m_data[0];
  dVar3 = (this->coord_dtdt).pos.m_data[1];
  dVar4 = (this->coord_dtdt).pos.m_data[2];
  dVar5 = (this->coord_dt).rot.m_data[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar5;
  dVar6 = (this->coord_dt).rot.m_data[1];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar6;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar6 * dVar1;
  auVar19 = vfmsub231sd_fma(auVar27,auVar22,ZEXT816(0) << 0x40);
  dVar1 = (this->coord_dt).rot.m_data[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar1;
  auVar19 = vfnmadd231sd_fma(auVar19,auVar29,auVar8);
  dVar7 = (this->coord_dt).rot.m_data[3];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar7;
  auVar16 = vfnmadd231sd_fma(auVar19,auVar31,auVar12);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar6 * 0.0;
  auVar19 = vfmadd231sd_fma(auVar33,auVar22,auVar10);
  auVar19 = vfnmadd231sd_fma(auVar19,auVar31,auVar8);
  auVar19 = vfmadd231sd_fma(auVar19,auVar29,auVar12);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar1 * 0.0;
  auVar14 = vfmadd231sd_fma(auVar35,auVar22,auVar8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar31,auVar10);
  auVar18 = vfnmadd231sd_fma(auVar14,auVar25,auVar12);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar7 * 0.0;
  auVar14 = vfmadd231sd_fma(auVar14,auVar22,auVar12);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar29,auVar10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar25,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = auVar19._0_8_ * dVar5;
  auVar9 = vfnmadd231sd_fma(auVar9,auVar16,auVar25);
  auVar9 = vfmadd231sd_fma(auVar9,auVar14,auVar29);
  auVar8 = vfnmadd231sd_fma(auVar9,auVar18,auVar31);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar18._0_8_ * dVar5;
  auVar9 = vfnmadd231sd_fma(auVar11,auVar16,auVar29);
  auVar9 = vfnmadd231sd_fma(auVar9,auVar14,auVar25);
  auVar9 = vfmadd231sd_fma(auVar9,auVar19,auVar31);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar5 * auVar14._0_8_;
  auVar14 = vfnmadd231sd_fma(auVar13,auVar31,auVar16);
  auVar14 = vfmadd231sd_fma(auVar14,auVar25,auVar18);
  auVar19 = vfnmadd231sd_fma(auVar14,auVar29,auVar19);
  in_RDI->m_data[0] = 0.0;
  in_RDI->m_data[1] = 0.0;
  in_RDI->m_data[0] = auVar17._0_8_ + auVar17._0_8_ + dVar2 + auVar8._0_8_ + auVar8._0_8_;
  in_RDI->m_data[1] = auVar15._0_8_ + auVar15._0_8_ + dVar3 + auVar9._0_8_ + auVar9._0_8_;
  in_RDI->m_data[2] = auVar23._0_8_ + auVar23._0_8_ + dVar4 + auVar19._0_8_ + auVar19._0_8_;
  return in_RDI;
}

Assistant:

ChVector<Real> PointAccelerationLocalToParent(const ChVector<Real>& localpos) const {
        return coord_dtdt.pos +
               ((coord_dtdt.rot % ChQuaternion<Real>(0, localpos) % this->coord.rot.GetConjugate()).GetVector() * 2) +
               ((coord_dt.rot % ChQuaternion<Real>(0, localpos) % coord_dt.rot.GetConjugate()).GetVector() * 2);
    }